

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O1

void ** __thiscall llvm::SmallPtrSetImplBase::find_imp(SmallPtrSetImplBase *this,void *Ptr)

{
  void **ppvVar1;
  void **ppvVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  ppvVar2 = this->SmallArray;
  if (this->CurArray == ppvVar2) {
    uVar3 = (ulong)this->NumNonEmpty;
    bVar5 = uVar3 == 0;
    if ((!bVar5) && (*ppvVar2 != Ptr)) {
      lVar4 = uVar3 * 8;
      do {
        ppvVar2 = ppvVar2 + 1;
        lVar4 = lVar4 + -8;
        bVar5 = lVar4 == 0;
        if (bVar5) break;
      } while (*ppvVar2 != Ptr);
    }
    ppvVar1 = this->CurArray + uVar3;
    if (!bVar5) {
      ppvVar1 = ppvVar2;
    }
  }
  else {
    ppvVar1 = FindBucketFor(this,Ptr);
    if (*ppvVar1 != Ptr) {
      ppvVar1 = this->CurArray + (&this->CurArraySize)[this->CurArray == this->SmallArray];
    }
  }
  return ppvVar1;
}

Assistant:

const void *const * find_imp(const void * Ptr) const {
    if (isSmall()) {
      // Linear search for the item.
      for (const void *const *APtr = SmallArray,
                      *const *E = SmallArray + NumNonEmpty; APtr != E; ++APtr)
        if (*APtr == Ptr)
          return APtr;
      return EndPointer();
    }

    // Big set case.
    auto *Bucket = FindBucketFor(Ptr);
    if (*Bucket == Ptr)
      return Bucket;
    return EndPointer();
  }